

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::ExprTree::ExprTree(ExprTree *this,ExprTree *param_1)

{
  pointer pEVar1;
  pointer this_00;
  long lVar2;
  pointer pEVar3;
  ExprTree *__cur;
  
  this->expr = param_1->expr;
  lVar2 = (long)(param_1->children).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->children).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->children).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = std::
            _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                           *)(lVar2 / 0x28),(size_t)param_1);
  (this->children).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_start = this_00;
  (this->children).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_00;
  (this->children).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar2 + (long)this_00);
  pEVar1 = (param_1->children).
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar3 = (param_1->children).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    ExprTree(this_00,pEVar3);
    this_00 = this_00 + 1;
  }
  (this->children).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_00;
  this->result_count = param_1->result_count;
  return;
}

Assistant:

explicit ExprTree(const Expr* expr, Index result_count)
      : expr(expr), result_count(result_count) {}